

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlSetAttrItem::GenerateActionEngineCode
          (GdlSetAttrItem *this,GrcManager *pcman,uint32_t fxdRuleVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,GdlRule *param_4,int irit,
          bool *pfSetInsertToFalse)

{
  uint uVar1;
  bool bVar2;
  undefined8 in_RAX;
  uchar *__args;
  undefined4 local_38;
  int local_34;
  
  __args = (uchar *)&local_38;
  if (((this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
       _M_impl.super__Vector_impl_data._M_start) && (*pfSetInsertToFalse == false)) {
    __args = (uchar *)((long)&local_38 + 3);
    local_34 = (int)((ulong)in_RAX >> 0x20);
    local_38._0_3_ = (undefined3)in_RAX;
    local_38 = CONCAT13(0x1b,(undefined3)local_38);
  }
  else {
    local_38 = (undefined4)in_RAX;
    _local_38 = CONCAT44(irit,local_38);
    uVar1 = (this->super_GdlRuleItem).m_nInputIndex;
    local_38._0_2_ = (ushort)in_RAX;
    local_38._0_3_ = CONCAT12(0x1e,(ushort)local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (vbOutput,(uchar *)((long)&local_38 + 2));
    local_38._0_2_ = (ushort)(byte)local_38;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (vbOutput,(uchar *)((long)&local_38 + 1));
    if (*pfSetInsertToFalse == true) {
      GdlRuleItem::GenerateInsertEqualsFalse(vbOutput);
    }
    bVar2 = GenerateAttrSettingCode
                      (this,pcman,fxdRuleVersion,vbOutput,local_34,(int)uVar1 >> 0x1f ^ uVar1);
    *pfSetInsertToFalse = bVar2;
    _local_38 = CONCAT71(stack0xffffffffffffffc9,0x19);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (vbOutput,__args);
  return;
}

Assistant:

void GdlSetAttrItem::GenerateActionEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion,
	std::vector<gr::byte> & vbOutput,
	GdlRule * /*prule*/, int irit, bool * pfSetInsertToFalse)
{
	if (m_vpavs.size() == 0 && !*pfSetInsertToFalse)
		vbOutput.push_back(kopCopyNext);
	else
	{
		int nIIndex = m_nInputIndex;
		nIIndex = (nIIndex < 0) ? (nIIndex + 1) * -1 : nIIndex;

		vbOutput.push_back(kopPutCopy);
		vbOutput.push_back(0);
		if (*pfSetInsertToFalse)
			GenerateInsertEqualsFalse(vbOutput);
		*pfSetInsertToFalse = GenerateAttrSettingCode(pcman, fxdRuleVersion, vbOutput,
			irit, nIIndex);
		vbOutput.push_back(kopNext);
	}
}